

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
::write_decimal<unsigned_int>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
           *this,uint value)

{
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> bVar1;
  uint in_ESI;
  value_type_conflict *in_RDI;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *it;
  int num_digits;
  bool is_negative;
  main_type abs_value;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
  *in_stack_ffffffffffffffc0;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> in_stack_ffffffffffffffc8;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> local_30;
  undefined4 local_24;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *local_20;
  int local_18;
  byte local_11;
  uint local_10;
  
  local_10 = in_ESI;
  local_11 = internal::is_negative<unsigned_int>(in_ESI);
  if ((bool)local_11) {
    local_10 = -local_10;
  }
  local_18 = internal::count_digits(local_10);
  local_20 = reserve(in_stack_ffffffffffffffc0,(size_t)in_RDI);
  if ((local_11 & 1) != 0) {
    local_24 = 0x2d;
    local_30 = std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>::
               operator++(local_20,0);
    std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>::operator*(&local_30)
    ;
    std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>::operator=
              (&in_stack_ffffffffffffffc0->out_,in_RDI);
  }
  bVar1 = internal::
          format_decimal<wchar_t,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,unsigned_int>
                    (in_stack_ffffffffffffffc8,(uint)((ulong)local_20->container >> 0x20),
                     (int)local_20->container);
  local_20->container = bVar1.container;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }